

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O2

void SetPointer(FState *state,PFunction *sym,int frame)

{
  ulong uVar1;
  CodePointerAlias *pCVar2;
  MBFParamState newstate;
  MBFParamState local_10;
  
  if (sym == (PFunction *)0x0) {
    state->ActionFunc = (VMFunction *)0x0;
    return;
  }
  state->ActionFunc = ((sym->Variants).Array)->Implementation;
  uVar1 = 0;
  pCVar2 = MBFCodePointers.Array;
  while( true ) {
    if (MBFCodePointers.Count == uVar1) {
      return;
    }
    if (*(int *)&(sym->super_PSymbol).super_DObject.field_0x24 == (pCVar2->name).Index) break;
    uVar1 = uVar1 + 1;
    pCVar2 = pCVar2 + 1;
  }
  local_10.pointer = (int)uVar1;
  local_10.state = state;
  TArray<MBFParamState,_MBFParamState>::Push(&MBFParamStates,&local_10);
  return;
}

Assistant:

static void SetPointer(FState *state, PFunction *sym, int frame = 0)
{
	if (sym == NULL)
	{
		state->ClearAction();
		return;
	}
	else
	{
		state->SetAction(sym->Variants[0].Implementation);

		for (unsigned int i = 0; i < MBFCodePointers.Size(); i++)
		{
			if (sym->SymbolName == MBFCodePointers[i].name)
			{
				MBFParamState newstate;
				newstate.state = state;
				newstate.pointer = i;
				MBFParamStates.Push(newstate);
				break; // No need to cycle through the rest of the list.
			}
		}
	}
}